

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

void __thiscall google::protobuf::DynamicMessage::SharedCtor(DynamicMessage *this,bool lock_factory)

{
  Descriptor *this_00;
  DynamicMessageFactory *pDVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  CppType CVar5;
  int32_t iVar6;
  uint32_t uVar7;
  OneofDescriptor *this_01;
  undefined4 *puVar8;
  ExtensionSet *this_02;
  Arena *pAVar9;
  FieldDescriptor *field_00;
  DynamicMapField *this_03;
  EnumValueDescriptor *this_04;
  FieldOptions *this_05;
  string *psVar10;
  string *value;
  Descriptor *pDVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Message *pMVar12;
  float fVar13;
  _func_int **pp_Var14;
  ArenaStringPtr *asp;
  string *default_value;
  void *field_ptr;
  FieldDescriptor *field;
  int local_48;
  int i_1;
  int i;
  int oneof_count;
  Descriptor *descriptor;
  bool lock_factory_local;
  DynamicMessage *this_local;
  
  this_00 = this->type_info_->type;
  i_1 = 0;
  for (local_48 = 0; iVar4 = Descriptor::oneof_decl_count(this_00), local_48 < iVar4;
      local_48 = local_48 + 1) {
    this_01 = Descriptor::oneof_decl(this_00,local_48);
    bVar2 = OneofDescriptor::is_synthetic(this_01);
    if (!bVar2) {
      puVar8 = (undefined4 *)MutableOneofCaseRaw(this,i_1);
      *puVar8 = 0;
      i_1 = i_1 + 1;
    }
  }
  if (this->type_info_->extensions_offset != -1) {
    this_02 = (ExtensionSet *)MutableExtensionsRaw(this);
    pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
    internal::ExtensionSet::ExtensionSet(this_02,pAVar9);
  }
  for (field._4_4_ = 0; iVar4 = Descriptor::field_count(this_00), field._4_4_ < iVar4;
      field._4_4_ = field._4_4_ + 1) {
    field_00 = Descriptor::field(this_00,field._4_4_);
    this_03 = (DynamicMapField *)MutableRaw(this,field._4_4_);
    bVar2 = anon_unknown_0::InRealOneof(field_00);
    if (!bVar2) {
      CVar5 = FieldDescriptor::cpp_type(field_00);
      switch(CVar5) {
      case CPPTYPE_INT32:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
          RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_03,pAVar9);
        }
        else {
          iVar6 = FieldDescriptor::default_value_int32_t(field_00);
          *(int32_t *)
           &(this_03->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = iVar6;
        }
        break;
      case CPPTYPE_INT64:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
          RepeatedField<long>::RepeatedField((RepeatedField<long> *)this_03,pAVar9);
        }
        else {
          pp_Var14 = (_func_int **)FieldDescriptor::default_value_int64_t(field_00);
          (this_03->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = pp_Var14;
        }
        break;
      case CPPTYPE_UINT32:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
          RepeatedField<unsigned_int>::RepeatedField((RepeatedField<unsigned_int> *)this_03,pAVar9);
        }
        else {
          uVar7 = FieldDescriptor::default_value_uint32_t(field_00);
          *(uint32_t *)
           &(this_03->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase = uVar7;
        }
        break;
      case CPPTYPE_UINT64:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
          RepeatedField<unsigned_long>::RepeatedField
                    ((RepeatedField<unsigned_long> *)this_03,pAVar9);
        }
        else {
          pp_Var14 = (_func_int **)FieldDescriptor::default_value_uint64_t(field_00);
          (this_03->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = pp_Var14;
        }
        break;
      case CPPTYPE_DOUBLE:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
          RepeatedField<double>::RepeatedField((RepeatedField<double> *)this_03,pAVar9);
        }
        else {
          pp_Var14 = (_func_int **)FieldDescriptor::default_value_double(field_00);
          (this_03->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = pp_Var14;
        }
        break;
      case CPPTYPE_FLOAT:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
          RepeatedField<float>::RepeatedField((RepeatedField<float> *)this_03,pAVar9);
        }
        else {
          fVar13 = FieldDescriptor::default_value_float(field_00);
          *(float *)&(this_03->
                     super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                     ).super_MapFieldBase._vptr_MapFieldBase = fVar13;
        }
        break;
      case CPPTYPE_BOOL:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
          RepeatedField<bool>::RepeatedField((RepeatedField<bool> *)this_03,pAVar9);
        }
        else {
          bVar2 = FieldDescriptor::default_value_bool(field_00);
          *(bool *)&(this_03->
                    super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                    ).super_MapFieldBase._vptr_MapFieldBase = bVar2;
        }
        break;
      case CPPTYPE_ENUM:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
          RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_03,pAVar9);
        }
        else {
          this_04 = FieldDescriptor::default_value_enum(field_00);
          iVar4 = EnumValueDescriptor::number(this_04);
          *(int *)&(this_03->
                   super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                   ).super_MapFieldBase._vptr_MapFieldBase = iVar4;
        }
        break;
      case CPPTYPE_STRING:
        this_05 = FieldDescriptor::options(field_00);
        FieldOptions::ctype(this_05);
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)this_03,pAVar9);
        }
        else {
          FieldDescriptor::default_value_string_abi_cxx11_(field_00);
          bVar3 = std::__cxx11::string::empty();
          psVar10 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
          value = (string *)0x0;
          if ((bVar3 & 1) != 0) {
            value = psVar10;
          }
          memset(this_03,0,8);
          internal::ArenaStringPtr::UnsafeSetDefault((ArenaStringPtr *)this_03,value);
        }
        break;
      case CPPTYPE_MESSAGE:
        bVar2 = FieldDescriptor::is_repeated(field_00);
        if (bVar2) {
          bVar2 = anon_unknown_0::IsMapFieldInApi(field_00);
          if (bVar2) {
            if (lock_factory) {
              pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
              if (pAVar9 == (Arena *)0x0) {
                pDVar1 = this->type_info_->factory;
                pDVar11 = FieldDescriptor::message_type(field_00);
                iVar4 = (*(pDVar1->super_MessageFactory)._vptr_MessageFactory[2])(pDVar1,pDVar11);
                internal::DynamicMapField::DynamicMapField
                          (this_03,(Message *)CONCAT44(extraout_var_00,iVar4));
              }
              else {
                pDVar1 = this->type_info_->factory;
                pDVar11 = FieldDescriptor::message_type(field_00);
                iVar4 = (*(pDVar1->super_MessageFactory)._vptr_MessageFactory[2])(pDVar1,pDVar11);
                pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
                internal::DynamicMapField::DynamicMapField
                          (this_03,(Message *)CONCAT44(extraout_var,iVar4),pAVar9);
                pAVar9 = MessageLite::GetOwningArena((MessageLite *)this);
                if ((pAVar9 != (Arena *)0x0) &&
                   (pAVar9 = MessageLite::GetOwningArena((MessageLite *)this),
                   this_03 != (DynamicMapField *)0x0)) {
                  internal::ThreadSafeArena::AddCleanup
                            ((ThreadSafeArena *)pAVar9,this_03,
                             internal::
                             arena_destruct_object<google::protobuf::internal::DynamicMapField>);
                }
              }
            }
            else {
              pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
              if (pAVar9 == (Arena *)0x0) {
                pDVar1 = this->type_info_->factory;
                pDVar11 = FieldDescriptor::message_type(field_00);
                pMVar12 = DynamicMessageFactory::GetPrototypeNoLock(pDVar1,pDVar11);
                internal::DynamicMapField::DynamicMapField(this_03,pMVar12);
              }
              else {
                pDVar1 = this->type_info_->factory;
                pDVar11 = FieldDescriptor::message_type(field_00);
                pMVar12 = DynamicMessageFactory::GetPrototypeNoLock(pDVar1,pDVar11);
                pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
                internal::DynamicMapField::DynamicMapField(this_03,pMVar12,pAVar9);
                pAVar9 = MessageLite::GetOwningArena((MessageLite *)this);
                if ((pAVar9 != (Arena *)0x0) &&
                   (pAVar9 = MessageLite::GetOwningArena((MessageLite *)this),
                   this_03 != (DynamicMapField *)0x0)) {
                  internal::ThreadSafeArena::AddCleanup
                            ((ThreadSafeArena *)pAVar9,this_03,
                             internal::
                             arena_destruct_object<google::protobuf::internal::DynamicMapField>);
                }
              }
            }
          }
          else {
            pAVar9 = MessageLite::GetArenaForAllocation((MessageLite *)this);
            RepeatedPtrField<google::protobuf::Message>::RepeatedPtrField
                      ((RepeatedPtrField<google::protobuf::Message> *)this_03,pAVar9);
          }
        }
        else {
          (this_03->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase._vptr_MapFieldBase = (_func_int **)0x0;
        }
      }
    }
  }
  return;
}

Assistant:

void DynamicMessage::SharedCtor(bool lock_factory) {
  // We need to call constructors for various fields manually and set
  // default values where appropriate.  We use placement new to call
  // constructors.  If you haven't heard of placement new, I suggest Googling
  // it now.  We use placement new even for primitive types that don't have
  // constructors for consistency.  (In theory, placement new should be used
  // any time you are trying to convert untyped memory to typed memory, though
  // in practice that's not strictly necessary for types that don't have a
  // constructor.)

  const Descriptor* descriptor = type_info_->type;
  // Initialize oneof cases.
  int oneof_count = 0;
  for (int i = 0; i < descriptor->oneof_decl_count(); ++i) {
    if (descriptor->oneof_decl(i)->is_synthetic()) continue;
    new (MutableOneofCaseRaw(oneof_count++)) uint32_t{0};
  }

  if (type_info_->extensions_offset != -1) {
    new (MutableExtensionsRaw()) ExtensionSet(GetArenaForAllocation());
  }
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = MutableRaw(i);
    if (InRealOneof(field)) {
      continue;
    }
    switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                                  \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                          \
    if (!field->is_repeated()) {                                    \
      new (field_ptr) TYPE(field->default_value_##TYPE());          \
    } else {                                                        \
      new (field_ptr) RepeatedField<TYPE>(GetArenaForAllocation()); \
    }                                                               \
    break;

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_ENUM:
        if (!field->is_repeated()) {
          new (field_ptr) int{field->default_value_enum()->number()};
        } else {
          new (field_ptr) RepeatedField<int>(GetArenaForAllocation());
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->options().ctype()) {
          default:  // TODO(kenton):  Support other string reps.
          case FieldOptions::STRING:
            if (!field->is_repeated()) {
              const std::string* default_value =
                  field->default_value_string().empty()
                      ? &internal::GetEmptyStringAlreadyInited()
                      : nullptr;
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->UnsafeSetDefault(default_value);
            } else {
              new (field_ptr)
                  RepeatedPtrField<std::string>(GetArenaForAllocation());
            }
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (!field->is_repeated()) {
          new (field_ptr) Message*(nullptr);
        } else {
          if (IsMapFieldInApi(field)) {
            // We need to lock in most cases to avoid data racing. Only not lock
            // when the constructor is called inside GetPrototype(), in which
            // case we have already locked the factory.
            if (lock_factory) {
              if (GetArenaForAllocation() != nullptr) {
                new (field_ptr) DynamicMapField(
                    type_info_->factory->GetPrototype(field->message_type()),
                    GetArenaForAllocation());
                if (GetOwningArena() != nullptr) {
                  // Needs to destroy the mutex member.
                  GetOwningArena()->OwnDestructor(
                      static_cast<DynamicMapField*>(field_ptr));
                }
              } else {
                new (field_ptr) DynamicMapField(
                    type_info_->factory->GetPrototype(field->message_type()));
              }
            } else {
              if (GetArenaForAllocation() != nullptr) {
                new (field_ptr)
                    DynamicMapField(type_info_->factory->GetPrototypeNoLock(
                                        field->message_type()),
                                    GetArenaForAllocation());
                if (GetOwningArena() != nullptr) {
                  // Needs to destroy the mutex member.
                  GetOwningArena()->OwnDestructor(
                      static_cast<DynamicMapField*>(field_ptr));
                }
              } else {
                new (field_ptr)
                    DynamicMapField(type_info_->factory->GetPrototypeNoLock(
                        field->message_type()));
              }
            }
          } else {
            new (field_ptr) RepeatedPtrField<Message>(GetArenaForAllocation());
          }
        }
        break;
      }
    }
  }
}